

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O2

size_t bufferToRle(uint8_t *buffer,int size,int offsetX,int y,Span *out)

{
  uint8_t uVar1;
  short sVar2;
  uint8_t uVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  uint8_t uVar9;
  
  uVar9 = *buffer;
  lVar7 = 0;
  iVar8 = 0;
  if (0 < size) {
    iVar8 = size;
  }
  sVar4 = 0;
  iVar5 = 0;
  while( true ) {
    iVar6 = (int)lVar7;
    sVar2 = (short)iVar5;
    if (iVar8 == iVar6) break;
    uVar1 = buffer[lVar7];
    uVar3 = uVar9;
    if ((uVar9 != uVar1) && (uVar3 = uVar1, iVar5 = iVar6, uVar9 != '\0')) {
      out->y = (short)y;
      out->x = sVar2 + (short)offsetX;
      out->len = (short)lVar7 - sVar2;
      out->coverage = uVar9;
      out = out + 1;
      sVar4 = sVar4 + 1;
    }
    uVar9 = uVar3;
    lVar7 = lVar7 + 1;
  }
  if (uVar9 != '\0') {
    out->y = (short)y;
    out->x = (short)offsetX + sVar2;
    out->len = (short)size - sVar2;
    out->coverage = uVar9;
    sVar4 = sVar4 + 1;
  }
  return sVar4;
}

Assistant:

size_t bufferToRle(uint8_t *buffer, int size, int offsetX, int y,
                   VRle::Span *out)
{
    size_t count = 0;
    uint8_t value = buffer[0];
    int    curIndex = 0;

    // size = offsetX < 0 ? size + offsetX : size;
    for (int i = 0; i < size; i++) {
        uint8_t curValue = buffer[0];
        if (value != curValue) {
            if (value) {
                out->y = y;
                out->x = offsetX + curIndex;
                out->len = i - curIndex;
                out->coverage = value;
                out++;
                count++;
            }
            curIndex = i;
            value = curValue;
        }
        buffer++;
    }
    if (value) {
        out->y = y;
        out->x = offsetX + curIndex;
        out->len = size - curIndex;
        out->coverage = value;
        count++;
    }
    return count;
}